

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffBoundsImp<4>::propagate(AllDiffBoundsImp<4> *this)

{
  bool bVar1;
  int iVar2;
  
  if ((sat.assigns.data[(uint)(this->b).v] == '\0') ||
     (bVar1 = true, (uint)(this->b).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->b).v])) {
    sortit(this);
    bVar1 = filterlower(this);
    if (bVar1) {
      if ((sat.assigns.data[(uint)(this->b).v] == '\0') ||
         (bVar1 = true, (uint)(this->b).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->b).v])) {
        iVar2 = filterupper(this);
        bVar1 = iVar2 != 0;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			return true;
		}
		sortit();
		if (!filterlower()) {
			return false;
		}
		if (b.isFixed() && b.isFalse()) {
			return true;
		}
		return filterupper();
	}